

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O3

SQInteger __thiscall
SQFunctionProto::GetLine(SQFunctionProto *this,SQInstruction *curr,int *hint,bool *is_line_op)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  SQLineInfo *pSVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  
  iVar7 = (int)this->_nlineinfos + -1;
  iVar5 = (int)((ulong)((long)curr + (-0xf8 - (long)this)) >> 3);
  if (hint != (int *)0x0) {
    iVar9 = *hint;
    lVar8 = (long)iVar9;
    if (iVar9 < iVar7) {
      pSVar4 = this->_lineinfos;
      if ((iVar5 <= pSVar4[lVar8]._op) || (pSVar4[lVar8 + 1]._op < iVar5)) {
        if (pSVar4[lVar8 + 1]._op + 1 != iVar5) {
          if (iVar5 == 0) {
            if (is_line_op != (bool *)0x0) {
              *is_line_op = SUB41((uint)*(undefined4 *)&pSVar4[lVar8].field_0x4 >> 0x1f,0);
            }
            uVar3 = *(uint *)&pSVar4->field_0x4;
            goto LAB_00138cc2;
          }
          goto LAB_00138c32;
        }
        lVar8 = lVar8 + 1;
        *hint = iVar9 + 1;
      }
      if (is_line_op != (bool *)0x0) {
        *is_line_op = SUB41((uint)*(undefined4 *)&pSVar4[lVar8].field_0x4 >> 0x1f,0);
      }
      uVar3 = *(uint *)&pSVar4[lVar8].field_0x4;
      goto LAB_00138cc2;
    }
  }
LAB_00138c32:
  if (iVar7 < 0) {
    uVar6 = 0;
LAB_00138c9f:
    pSVar4 = this->_lineinfos;
  }
  else {
    iVar9 = 0;
    do {
      uVar6 = (iVar7 - iVar9 >> 1) + iVar9;
      lVar8 = (long)(int)uVar6;
      iVar1 = this->_lineinfos[lVar8]._op;
      if (iVar5 < iVar1) {
        iVar7 = uVar6 - 1;
      }
      else {
        if ((iVar5 <= iVar1) ||
           ((lVar8 < this->_nlineinfos + -1 && (iVar5 <= this->_lineinfos[lVar8 + 1]._op)))) break;
        iVar9 = uVar6 + 1;
      }
    } while (iVar9 <= iVar7);
    if ((int)uVar6 < 1) goto LAB_00138c9f;
    pSVar4 = this->_lineinfos;
    do {
      if (pSVar4[uVar6]._op < iVar5) goto LAB_00138ca6;
      bVar2 = 1 < (int)uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar2);
    uVar6 = 0;
  }
LAB_00138ca6:
  uVar3 = *(uint *)&pSVar4[(int)uVar6].field_0x4;
  if (is_line_op != (bool *)0x0) {
    *is_line_op = SUB41(uVar3 >> 0x1f,0);
  }
  if (hint != (int *)0x0) {
    *hint = uVar6;
  }
LAB_00138cc2:
  return (ulong)(uVar3 & 0x7fffffff);
}

Assistant:

SQInteger SQFunctionProto::GetLine(SQInstruction *curr, int *hint, bool *is_line_op)
{
    int op = (int)(curr-_instructions);
    int high = _nlineinfos - 1;

    if (hint && *hint < high) {
        int pos = *hint;
        if (op > _lineinfos[pos]._op && op <= _lineinfos[pos + 1]._op) {
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[pos]._line;
        }
        if (op == _lineinfos[pos + 1]._op + 1) {
            *hint = ++pos;
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[pos]._line;
        }
        if (!op) {
            if (is_line_op)
                *is_line_op = _lineinfos[pos]._is_line_op;
            return _lineinfos[0]._line;
        }
    }

    int line = 0;
    int low = 0;
    int mid = 0;
    while(low <= high)
    {
        mid = low + ((high - low) >> 1);
        int curop = _lineinfos[mid]._op;
        if(curop > op) {
            high = mid - 1;
        }
        else if(curop < op) {
            if(mid < (_nlineinfos - 1)
                && _lineinfos[mid + 1]._op >= op) {
                break;
            }
            low = mid + 1;
        }
        else { //equal
            break;
        }
    }

    while(mid > 0 && _lineinfos[mid]._op >= op) mid--;

    line = _lineinfos[mid]._line;

    if (is_line_op)
        *is_line_op = _lineinfos[mid]._is_line_op;

    if (hint)
        *hint = mid;

    return line;
}